

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToOneInstance::verifyImage
          (TestStatus *__return_storage_ptr__,AlphaToOneInstance *this,
          ConstPixelBufferAccess *alphaOneImage,ConstPixelBufferAccess *noAlphaOneImage)

{
  bool bVar1;
  ostream *poVar2;
  int z;
  int y;
  ostringstream message;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [16];
  ConstPixelBufferAccess local_1a8 [9];
  
  z = 0;
  do {
    if ((this->m_renderSize).m_data[1] <= z) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_1b8 + 0x10),
                 "Image rendered with alpha-to-one contains pixels of image rendered with no alpha-to-one"
                 ,(allocator<char> *)local_1d8);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)(local_1b8 + 0x10));
      std::__cxx11::string::~string((string *)(local_1b8 + 0x10));
      return __return_storage_ptr__;
    }
    for (y = 0; y < (this->m_renderSize).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(local_1b8 + 0x10),(int)alphaOneImage,y,z);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_1d8,(int)noAlphaOneImage,y,z);
      tcu::greaterThanEqual<float,4>
                ((tcu *)local_1b8,(Vector<float,_4> *)(local_1b8 + 0x10),
                 (Vector<float,_4> *)local_1d8);
      bVar1 = tcu::boolAll<4>((Vector<bool,_4> *)local_1b8);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
        poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10),"Unsatisfied condition: ");
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_1d8,(int)alphaOneImage,y,z);
        poVar2 = tcu::operator<<(poVar2,(Vector<float,_4> *)local_1d8);
        poVar2 = std::operator<<(poVar2," >= ");
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_1b8,(int)noAlphaOneImage,y,z);
        tcu::operator<<(poVar2,(Vector<float,_4> *)local_1b8);
        std::__cxx11::stringbuf::str();
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1d8);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
        return __return_storage_ptr__;
      }
    }
    z = z + 1;
  } while( true );
}

Assistant:

tcu::TestStatus AlphaToOneInstance::verifyImage (const tcu::ConstPixelBufferAccess&	alphaOneImage,
												 const tcu::ConstPixelBufferAccess&	noAlphaOneImage)
{
	for (int y = 0; y < m_renderSize.y(); y++)
	{
		for (int x = 0; x < m_renderSize.x(); x++)
		{
			if (!tcu::boolAll(tcu::greaterThanEqual(alphaOneImage.getPixel(x, y), noAlphaOneImage.getPixel(x, y))))
			{
				std::ostringstream message;
				message << "Unsatisfied condition: " << alphaOneImage.getPixel(x, y) << " >= " << noAlphaOneImage.getPixel(x, y);
				return tcu::TestStatus::fail(message.str());
			}
		}
	}

	return tcu::TestStatus::pass("Image rendered with alpha-to-one contains pixels of image rendered with no alpha-to-one");
}